

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  ModuleField *pMVar1;
  ModuleField *pMVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  _Head_base<0UL,_wabt::Import_*,_false> _Var6;
  string name;
  Location loc;
  _Head_base<0UL,_wabt::Import_*,_false> local_100;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_f0;
  string local_e8;
  GlobalModuleField *local_c8;
  size_type sStack_c0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_b8;
  undefined8 uStack_b0;
  ModuleFieldList local_a8;
  Token local_88;
  Location local_48;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_88,this);
  local_48.field_1.field_1.offset = local_88.loc.field_1.field_1.offset;
  local_48.field_1._8_8_ = local_88.loc.field_1._8_8_;
  local_48.filename.data_ = local_88.loc.filename.data_;
  local_48.filename.size_ = local_88.loc.filename.size_;
  RVar4 = Expect(this,Global);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ParseBindVarOpt(this,&local_e8);
  local_a8.size_ = 0;
  local_a8.first_ = (ModuleField *)0x0;
  local_a8.last_ = (ModuleField *)0x0;
  RVar4 = ParseInlineExports(this,&local_a8,Global);
  EVar5 = Error;
  pMVar2 = local_a8.first_;
  if (RVar4.enum_ == Error) goto joined_r0x00186038;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::GlobalImport,std::__cxx11::string&>((wabt *)&local_100,&local_e8);
    RVar4 = ParseInlineImport(this,local_100._M_head_impl);
    _Var6._M_head_impl = local_100._M_head_impl;
    if ((RVar4.enum_ != Error) &&
       (RVar4 = ParseGlobalType(this,(Global *)
                                     &(((Global *)((long)local_100._M_head_impl + 0x40))->name).
                                      field_2), _Var6._M_head_impl = local_100._M_head_impl,
       RVar4.enum_ != Error)) {
      GetToken(&local_88,this);
      local_b8.offset = (size_t)local_88.loc.field_1.field_1.offset;
      uStack_b0 = local_88.loc.field_1._8_8_;
      local_c8 = (GlobalModuleField *)local_88.loc.filename.data_;
      sStack_c0 = local_88.loc.filename.size_;
      local_f0._M_head_impl = (ImportModuleField *)operator_new(0x48);
      _Var6._M_head_impl = local_100._M_head_impl;
      local_100._M_head_impl = (Import *)0x0;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.data_ = (char *)local_c8;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.size_ = sStack_c0;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.field_1.field_1.offset = local_b8.offset;
      *(undefined8 *)
       ((long)&((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
               super_ModuleField.loc.field_1 + 8) = uStack_b0;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      type_ = Import;
      ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_00208360;
      ((local_f0._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var6._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_f0);
      if (local_f0._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_f0._M_head_impl = (ImportModuleField *)0x0;
      _Var6._M_head_impl = local_100._M_head_impl;
LAB_00185fee:
      if ((GlobalModuleField *)_Var6._M_head_impl != (GlobalModuleField *)0x0) {
        (*(((GlobalModuleField *)_Var6._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField._vptr_ModuleField[1])
                  ();
      }
      anon_unknown_1::AppendInlineExportFields
                (module,&local_a8,
                 (int)((ulong)((long)(module->globals).
                                     super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar4 = Expect(this,Rpar);
      EVar5 = (Enum)(RVar4.enum_ == Error);
      pMVar2 = local_a8.first_;
      goto joined_r0x00186038;
    }
  }
  else {
    MakeUnique<wabt::GlobalModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_88,&local_48,&local_e8);
    RVar4 = ParseGlobalType(this,(Global *)((long)local_88.loc.filename.data_ + 0x40));
    _Var6._M_head_impl = (Import *)local_88.loc.filename.data_;
    if ((RVar4.enum_ != Error) &&
       (RVar4 = ParseTerminatingInstrList
                          (this,&((Global *)((long)local_88.loc.filename.data_ + 0x40))->init_expr),
       _Var6._M_head_impl = (Import *)local_88.loc.filename.data_, RVar4.enum_ != Error)) {
      local_f8._M_head_impl = (GlobalModuleField *)local_88.loc.filename.data_;
      local_88.loc.filename.data_ = (char *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                  *)&local_f8);
      if (local_f8._M_head_impl != (GlobalModuleField *)0x0) {
        (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_f8._M_head_impl = (GlobalModuleField *)0x0;
      _Var6._M_head_impl = (Import *)local_88.loc.filename.data_;
      goto LAB_00185fee;
    }
  }
  pMVar2 = local_a8.first_;
  if ((GlobalModuleField *)_Var6._M_head_impl != (GlobalModuleField *)0x0) {
    (*(((GlobalModuleField *)_Var6._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
      super_ModuleField._vptr_ModuleField[1])();
    pMVar2 = local_a8.first_;
  }
joined_r0x00186038:
  while (pMVar2 != (ModuleField *)0x0) {
    pMVar1 = (pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar2->_vptr_ModuleField[1])();
    pMVar2 = pMVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}